

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256_tests.cpp
# Opt level: O3

void uint256_tests::TestFromHex<transaction_identifier<true>>(void)

{
  char __c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  undefined1 **ppuVar7;
  char *pcVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator in_R9;
  iterator pvVar10;
  long lVar11;
  long in_FS_OFFSET;
  bool bVar12;
  const_string file;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  string_view str_00;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string chars_68;
  optional<transaction_identifier<true>_> valid_result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_input;
  string valid_64char_input;
  string invalid_prefix;
  optional<uint256> u;
  check_type cVar13;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  string *local_1a0;
  string *local_198;
  string *local_190;
  char *local_188;
  assertion_result local_180;
  string local_168;
  string local_148;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_118;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  readonly_property65 local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_70;
  undefined1 local_60 [32];
  bool local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF",
             "");
  pcVar6 = (char *)0x40;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_c0,&local_a0,0,0x40);
  str_01._M_str = pcVar6;
  str_01._M_len = (size_t)local_c0._M_dataplus._M_p;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_c0._M_string_length,str_01)
  ;
  local_c8.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_40 == true);
  if ((bool)local_c8.super_readonly_property<bool>.super_class_property<bool>.value) {
    local_e8.field_2._M_allocated_capacity = local_60._16_8_;
    local_e8.field_2._8_8_ = local_60._24_8_;
    local_e8._M_dataplus._M_p = (pointer)local_60._0_8_;
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x105;
  file.m_begin = (iterator)&local_1b0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1c0,msg);
  local_80[0] = local_c8.super_readonly_property<bool>.super_class_property<bool>.value;
  local_80._8_8_ = (element_type *)0x0;
  aStack_70._M_allocated_capacity = 0;
  local_60._24_8_ = local_108;
  local_108._0_8_ = "valid_result";
  local_108._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1c8 = "";
  pvVar9 = (iterator)0x2;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,(lazy_ostream *)local_60,2,0,WARN,_cVar13,
             (size_t)&local_1d0,0x105);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_70._M_allocated_capacity);
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x106;
  file_00.m_begin = (iterator)&local_1e0;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1f0,
             msg_00);
  local_108._8_8_ = local_108._8_8_ & 0xffffffffffffff00;
  local_108._0_8_ = &PTR__lazy_ostream_01388f08;
  aStack_f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_f8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  base_blob<256u>::ToString_abi_cxx11_((string *)local_128,&local_e8);
  str._M_str = local_c0._M_dataplus._M_p;
  str._M_len = local_c0._M_string_length;
  ToLower_abi_cxx11_(&local_148,str);
  if (local_128._8_8_ == local_148._M_string_length) {
    if ((element_type *)local_128._8_8_ == (element_type *)0x0) {
      local_168._M_dataplus._M_p._0_1_ = true;
    }
    else {
      iVar4 = bcmp((void *)local_128._0_8_,local_148._M_dataplus._M_p,local_128._8_8_);
      local_168._M_dataplus._M_p._0_1_ = iVar4 == 0;
    }
  }
  else {
    local_168._M_dataplus._M_p._0_1_ = false;
  }
  local_168._M_string_length = 0;
  local_168.field_2._M_allocated_capacity = 0;
  local_180._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_180.m_message.px = (element_type *)0xf48bcd;
  local_60._24_8_ = &local_190;
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_70._8_8_ = &local_198;
  local_198 = &local_148;
  local_80._8_8_ = local_80._8_8_ & 0xffffffffffffff00;
  local_80._0_8_ = &PTR__lazy_ostream_01388fc8;
  aStack_70._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar6 = "valid_result->ToString()";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_190 = (string *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_168,(lazy_ostream *)local_108,1,2,REQUIRE,0xf49a3d,
             (size_t)&local_180,0x106,(lazy_ostream *)local_60,"ToLower(valid_input)",
             (assertion_result *)local_80);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_168.field_2._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ != &aStack_118) {
    operator_delete((void *)local_128._0_8_,aStack_118._M_allocated_capacity + 1);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_1f8 = "";
  ppuVar7 = &local_210;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x10a;
  file_01.m_begin = (iterator)&local_200;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)ppuVar7,msg_01);
  str_02._M_str = (char *)ppuVar7;
  str_02._M_len = (size_t)"";
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x0,str_02);
  local_e8._M_dataplus._M_p = (pointer)(CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_40) ^ 1);
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_80._0_8_ = "!T::FromHex(\"\")";
  local_80._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_218 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (assertion_result *)local_80;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_220,0x10a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_e8.field_2._M_allocated_capacity);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_228 = "";
  ppuVar7 = &local_240;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x10b;
  file_02.m_begin = (iterator)&local_230;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)ppuVar7,msg_02);
  str_03._M_str = (char *)ppuVar7;
  str_03._M_len = (size_t)"0";
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x1,str_03);
  local_e8._M_dataplus._M_p = (pointer)(CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_40) ^ 1);
  local_e8._M_string_length = 0;
  local_e8.field_2._M_allocated_capacity = 0;
  local_80._0_8_ = "!T::FromHex(\"0\")";
  local_80._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_248 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (assertion_result *)local_80;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_e8,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_250,0x10b);
  paVar1 = &local_e8.field_2;
  boost::detail::shared_count::~shared_count((shared_count *)&paVar1->_M_allocated_capacity);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x10c;
  file_03.m_begin = (iterator)&local_260;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_270,
             msg_03);
  pcVar8 = (char *)0x20;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_e8,&local_c0,0,0x20);
  str_04._M_str = pcVar8;
  str_04._M_len = (size_t)local_e8._M_dataplus._M_p;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_e8._M_string_length,str_04)
  ;
  local_80._0_8_ = CONCAT71(local_80._1_7_,local_40) ^ 1;
  local_80._8_8_ = (element_type *)0x0;
  aStack_70._M_allocated_capacity = 0;
  local_108._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars / 2))";
  local_108._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_278 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (string *)local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_280,0x10c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_70._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x10d;
  file_04.m_begin = (iterator)&local_290;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2a0,
             msg_04);
  pcVar8 = (char *)0x3f;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_e8,&local_c0,0,0x3f);
  str_05._M_str = pcVar8;
  str_05._M_len = (size_t)local_e8._M_dataplus._M_p;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_e8._M_string_length,str_05)
  ;
  local_80._0_8_ = CONCAT71(local_80._1_7_,local_40) ^ 1;
  local_80._8_8_ = (element_type *)0x0;
  aStack_70._M_allocated_capacity = 0;
  local_108._0_8_ = "!T::FromHex(valid_input.substr(0, num_chars - 1))";
  local_108._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2a8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (string *)local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_2b0,0x10d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_70._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2b8 = "";
  ppuVar7 = &local_2d0;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x10e;
  file_05.m_begin = (iterator)&local_2c0;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)ppuVar7,msg_05);
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_c0._M_dataplus._M_p,
             (detail *)(local_c0._M_string_length + (long)local_c0._M_dataplus._M_p));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_e8,"0");
  str_06._M_str = (char *)ppuVar7;
  str_06._M_len = (size_t)local_e8._M_dataplus._M_p;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_e8._M_string_length,str_06)
  ;
  local_80._0_8_ = CONCAT71(local_80._1_7_,local_40) ^ 1;
  local_80._8_8_ = (element_type *)0x0;
  aStack_70._M_allocated_capacity = 0;
  local_108._0_8_ = "!T::FromHex(valid_input + \"0\")";
  local_108._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_2d8 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (string *)local_108;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_80,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_2e0,0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_70._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             " !\"#$%&\'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\\]^_`ghijklmnopqrstuvwxyz{|}~","");
  sVar3 = local_e8._M_string_length;
  _Var2._M_p = local_e8._M_dataplus._M_p;
  if ((detail *)local_e8._M_string_length != (detail *)0x0) {
    lVar11 = 0;
    do {
      __c = _Var2._M_p[lVar11];
      local_2f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_2e8 = "";
      local_300 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_06.m_end = (iterator)0x114;
      file_06.m_begin = (iterator)&local_2f0;
      msg_06.m_end = pvVar10;
      msg_06.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_300,
                 msg_06);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                 &local_c0,0,0x3f);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_108,local_108._8_8_,0,1,__c);
      local_80._0_8_ = &aStack_70;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar5->_M_dataplus)._M_p;
      str_07._M_str = &pbVar5->field_2;
      if (paVar1 == str_07._M_str) {
        aStack_70._M_allocated_capacity = (str_07._M_str)->_M_allocated_capacity;
        aStack_70._8_8_ = *(long *)((long)&pbVar5->field_2 + 8);
      }
      else {
        aStack_70._M_allocated_capacity = (str_07._M_str)->_M_allocated_capacity;
        local_80._0_8_ = paVar1;
      }
      local_80._8_8_ = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)str_07._M_str;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      str_07._M_len = local_80._0_8_;
      detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_80._8_8_,str_07);
      local_128._0_8_ = CONCAT71(local_128._1_7_,local_40) ^ 1;
      local_128._8_8_ = (element_type *)0x0;
      aStack_118._M_allocated_capacity = 0;
      local_148._M_dataplus._M_p = "!T::FromHex(valid_input.substr(0, num_chars - 1) + c)";
      local_148._M_string_length = 0xf49b8e;
      local_60[8] = '\0';
      local_60._0_8_ = &PTR__lazy_ostream_01389048;
      local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_60._24_8_ = &local_148;
      local_310 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
      ;
      local_308 = "";
      pvVar9 = (iterator)0x1;
      pvVar10 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_128,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
                 (size_t)&local_310,0x114);
      boost::detail::shared_count::~shared_count((shared_count *)&aStack_118._M_allocated_capacity);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._0_8_ != &aStack_70) {
        operator_delete((void *)local_80._0_8_,(ulong)(aStack_70._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._0_8_ != &aStack_f8) {
        operator_delete((void *)local_108._0_8_,(ulong)(aStack_f8._M_allocated_capacity + 1));
      }
      lVar11 = lVar11 + 1;
    } while (sVar3 != lVar11);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,"0x",
                 &local_c0);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_318 = "";
  ppuVar7 = &local_330;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x118;
  file_07.m_begin = (iterator)&local_320;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)ppuVar7,msg_07);
  str_08._M_str = (char *)ppuVar7;
  str_08._M_len = local_80._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x40,str_08);
  local_108._0_8_ = CONCAT71(local_108._1_7_,local_40) ^ 1;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_128._0_8_ = "!T::FromHex(std::string_view(invalid_prefix.data(), num_chars))";
  local_128._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_338 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_340,0x118);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8._M_allocated_capacity);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_348 = "";
  ppuVar7 = &local_360;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x119;
  file_08.m_begin = (iterator)&local_350;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)ppuVar7,msg_08);
  str_09._M_str = (char *)ppuVar7;
  str_09._M_len = local_80._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)local_80._8_8_,str_09);
  local_108._0_8_ = CONCAT71(local_108._1_7_,local_40) ^ 1;
  local_108._8_8_ = (element_type *)0x0;
  aStack_f8._M_allocated_capacity = 0;
  local_128._0_8_ = "!T::FromHex(invalid_prefix)";
  local_128._8_8_ = "";
  local_60[8] = '\0';
  local_60._0_8_ = &PTR__lazy_ostream_01389048;
  local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_368 = "";
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x0;
  local_60._24_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_108,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_370,0x119);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_f8._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._0_8_ != &aStack_70) {
    operator_delete((void *)local_80._0_8_,(ulong)(aStack_70._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  local_108._0_8_ = &aStack_f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_108,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,"0123");
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
  ;
  local_378 = "";
  ppuVar7 = &local_390;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x11e;
  file_09.m_begin = (iterator)&local_380;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)ppuVar7,msg_09);
  local_128._8_8_ = local_128._8_8_ & 0xffffffffffffff00;
  local_128._0_8_ = &PTR__lazy_ostream_01388f08;
  aStack_118._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_118._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  str_10._M_str = (char *)ppuVar7;
  str_10._M_len = local_108._0_8_;
  detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x40,str_10);
  if (local_40 == false) {
    local_c8.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      std::__throw_bad_optional_access();
    }
  }
  else {
    local_e8._M_string_length = CONCAT71(local_60._9_7_,local_60[8]);
    local_e8.field_2._M_allocated_capacity = local_60._16_8_;
    local_e8.field_2._8_8_ = local_60._24_8_;
    local_e8._M_dataplus._M_p = (pointer)local_60._0_8_;
    local_c8.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x1;
    base_blob<256u>::ToString_abi_cxx11_(&local_148,&local_e8);
    str_00._M_str = local_c0._M_dataplus._M_p;
    str_00._M_len = local_c0._M_string_length;
    ToLower_abi_cxx11_(&local_168,str_00);
    if (local_148._M_string_length == local_168._M_string_length) {
      if ((element_type *)local_148._M_string_length == (element_type *)0x0) {
        bVar12 = true;
      }
      else {
        iVar4 = bcmp(local_148._M_dataplus._M_p,
                     (void *)CONCAT71(local_168._M_dataplus._M_p._1_7_,
                                      local_168._M_dataplus._M_p._0_1_),local_148._M_string_length);
        bVar12 = iVar4 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar12;
    local_180.m_message.px = (element_type *)0x0;
    local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_190 = (string *)0xf48b67;
    local_188 = "";
    local_60[8] = '\0';
    local_60._0_8_ = &PTR__lazy_ostream_01388fc8;
    local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_60._24_8_ = &local_198;
    aStack_70._8_8_ = &local_1a0;
    local_80._8_8_ = local_80._8_8_ & 0xffffffffffffff00;
    local_80._0_8_ = &PTR__lazy_ostream_01388fc8;
    aStack_70._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    pcVar6 = "T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString()";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x2;
    local_1a0 = &local_168;
    local_198 = &local_148;
    boost::test_tools::tt_detail::report_assertion
              (&local_180,(lazy_ostream *)local_128,1,2,REQUIRE,0xf49bf0,(size_t)&local_190,0x11e,
               (optional<uint256> *)local_60,"ToLower(valid_input)",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_168._M_dataplus._M_p._1_7_,local_168._M_dataplus._M_p._0_1_) !=
        &local_168.field_2) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_168._M_dataplus._M_p._1_7_,local_168._M_dataplus._M_p._0_1_)
                      ,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_3a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_398 = "";
    ppuVar7 = &local_3b0;
    local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x11f;
    file_10.m_begin = (iterator)&local_3a0;
    msg_10.m_end = pvVar10;
    msg_10.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)ppuVar7,msg_10
              );
    str_11._M_str = (char *)ppuVar7;
    str_11._M_len = local_108._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x3f,str_11);
    local_e8._M_dataplus._M_p = (pointer)(CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_40) ^ 1);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    local_80._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))";
    local_80._8_8_ = "";
    local_60[8] = '\0';
    local_60._0_8_ = &PTR__lazy_ostream_01389048;
    local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3b8 = "";
    pvVar9 = (iterator)0x1;
    pvVar10 = (iterator)0x0;
    local_60._24_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
               (size_t)&local_3c0,0x11f);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_e8.field_2._M_allocated_capacity);
    local_3d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3c8 = "";
    ppuVar7 = &local_3e0;
    local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_11.m_end = (iterator)0x120;
    file_11.m_begin = (iterator)&local_3d0;
    msg_11.m_end = pvVar10;
    msg_11.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)ppuVar7,msg_11
              );
    str_12._M_str = (char *)ppuVar7;
    str_12._M_len = local_108._0_8_;
    detail::FromHex<uint256>((optional<uint256> *)local_60,(detail *)0x41,str_12);
    local_e8._M_dataplus._M_p = (pointer)(CONCAT71(local_e8._M_dataplus._M_p._1_7_,local_40) ^ 1);
    local_e8._M_string_length = 0;
    local_e8.field_2._M_allocated_capacity = 0;
    local_80._0_8_ = "!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))";
    local_80._8_8_ = "";
    local_60[8] = '\0';
    local_60._0_8_ = &PTR__lazy_ostream_01389048;
    local_60._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_3f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/uint256_tests.cpp"
    ;
    local_3e8 = "";
    local_60._24_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_e8,(lazy_ostream *)local_60,1,0,WARN,(check_type)pcVar6,
               (size_t)&local_3f0,0x120);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_e8.field_2._M_allocated_capacity);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ != &aStack_f8) {
      operator_delete((void *)local_108._0_8_,aStack_f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void TestFromHex()
{
    constexpr unsigned int num_chars{T::size() * 2};
    static_assert(num_chars <= 64); // this test needs to be modified to allow for more than 64 hex chars
    const std::string valid_64char_input{"0123456789abcdef0123456789ABCDEF0123456789abcdef0123456789ABCDEF"};
    const auto valid_input{valid_64char_input.substr(0, num_chars)};
    {
        // check that lower and upper case hex characters are accepted
        auto valid_result{T::FromHex(valid_input)};
        BOOST_REQUIRE(valid_result);
        BOOST_CHECK_EQUAL(valid_result->ToString(), ToLower(valid_input));
    }
    {
        // check that only strings of size num_chars are accepted
        BOOST_CHECK(!T::FromHex(""));
        BOOST_CHECK(!T::FromHex("0"));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars / 2)));
        BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1)));
        BOOST_CHECK(!T::FromHex(valid_input + "0"));
    }
    {
        // check that non-hex characters are not accepted
        std::string invalid_chars{R"( !"#$%&'()*+,-./:;<=>?@GHIJKLMNOPQRSTUVWXYZ[\]^_`ghijklmnopqrstuvwxyz{|}~)"};
        for (auto c : invalid_chars) {
            BOOST_CHECK(!T::FromHex(valid_input.substr(0, num_chars - 1) + c));
        }
        // 0x prefixes are invalid
        std::string invalid_prefix{"0x" + valid_input};
        BOOST_CHECK(!T::FromHex(std::string_view(invalid_prefix.data(), num_chars)));
        BOOST_CHECK(!T::FromHex(invalid_prefix));
    }
    {
        // check that string_view length is respected
        std::string chars_68{valid_64char_input + "0123"};
        BOOST_CHECK_EQUAL(T::FromHex(std::string_view(chars_68.data(), num_chars)).value().ToString(), ToLower(valid_input));
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars - 1))); // too short
        BOOST_CHECK(!T::FromHex(std::string_view(chars_68.data(), num_chars + 1))); // too long
    }
}